

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

void combine_pack(player *p)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  object_stack_t mode;
  object_stack_t mode2;
  object *poVar4;
  object_stack_t stack_mode1;
  object_stack_t stack_mode2;
  _Bool disable_repeat;
  _Bool display_message;
  object *prev;
  object *obj2;
  object *obj1;
  player *p_local;
  
  bVar1 = false;
  bVar2 = false;
  poVar4 = gear_last_item(p);
  do {
    obj2 = poVar4;
    if (obj2 == (object *)0x0) {
      calc_inventory(p);
      event_signal(EVENT_INVENTORY);
      event_signal(EVENT_EQUIPMENT);
      if ((bVar1) && (msg("You combine some items in your pack."), bVar2)) {
        cmd_disable_repeat();
      }
      return;
    }
    if (obj2->kind == (object_kind *)0x0) {
      __assert_fail("obj1->kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                    ,0x4f9,"void combine_pack(struct player *)");
    }
    _Var3 = tval_is_money(obj2);
    if (_Var3) {
      __assert_fail("!tval_is_money(obj1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                    ,0x4fa,"void combine_pack(struct player *)");
    }
    poVar4 = obj2->prev;
    for (prev = p->gear; prev != (object *)0x0 && prev != obj2; prev = prev->next) {
      _Var3 = object_is_in_quiver(p,prev);
      mode = OSTACK_PACK;
      if (_Var3) {
        mode = OSTACK_QUIVER;
      }
      if (prev->kind == (object_kind *)0x0) {
        __assert_fail("obj2->kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                      ,0x503,"void combine_pack(struct player *)");
      }
      _Var3 = object_mergeable(prev,obj2,mode);
      if (_Var3) {
        bVar1 = true;
        bVar2 = true;
        object_absorb(prev->known,obj2->known);
        obj2->known = (object *)0x0;
        object_absorb(prev,obj2);
        prev->known->number = prev->number;
        break;
      }
      _Var3 = object_is_in_quiver(p,obj2);
      mode2 = OSTACK_PACK;
      if (_Var3) {
        mode2 = OSTACK_QUIVER;
      }
      _Var3 = inven_can_stack_partial(p,prev,obj2,mode,mode2);
      if (_Var3) {
        object_absorb_partial(prev->known,obj2->known,mode,mode2);
        object_absorb_partial(prev,obj2,mode,mode2);
        prev->known->number = prev->number;
        obj2->known->number = obj2->number;
        break;
      }
    }
  } while( true );
}

Assistant:

void combine_pack(struct player *p)
{
	struct object *obj1, *obj2, *prev;
	bool display_message = false;
	bool disable_repeat = false;

	/* Combine the pack (backwards) */
	obj1 = gear_last_item(p);
	while (obj1) {
		assert(obj1->kind);
		assert(!tval_is_money(obj1));
		prev = obj1->prev;

		/* Scan the items above that item */
		for (obj2 = p->gear; obj2 && obj2 != obj1; obj2 = obj2->next) {
			object_stack_t stack_mode2 =
				object_is_in_quiver(p, obj2) ?
				OSTACK_QUIVER : OSTACK_PACK;

			assert(obj2->kind);

			/* Can we drop "obj1" onto "obj2"? */
			if (object_mergeable(obj2, obj1, stack_mode2)) {
				display_message = true;
				disable_repeat = true;
				object_absorb(obj2->known, obj1->known);
				obj1->known = NULL;
				object_absorb(obj2, obj1);

				/* Ensure numbers align (should not be necessary, but safer) */
				obj2->known->number = obj2->number;

				break;
			} else {
				object_stack_t stack_mode1 =
					object_is_in_quiver(p, obj1) ?
					OSTACK_QUIVER : OSTACK_PACK;

				if (inven_can_stack_partial(p, obj2, obj1,
						stack_mode2, stack_mode1)) {
					/*
					 * Don't display a message for this
					 * case:  shuffling items between
					 * stacks isn't interesting to the
					 * player.
					 */
					object_absorb_partial(obj2->known,
						obj1->known, stack_mode2,
						stack_mode1);
					object_absorb_partial(obj2, obj1,
						stack_mode2, stack_mode1);
					/*
					 * Ensure numbers align (should not be
					 * necessary, but safer)
					 */
					obj2->known->number = obj2->number;
					obj1->known->number = obj1->number;

					break;
				}
			}
		}
		obj1 = prev;
	}

	calc_inventory(p);

	/* Redraw gear */
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);

	/* Message */
	if (display_message) {
		msg("You combine some items in your pack.");

		/*
		 * Stop "repeat last command" from working if a stack was
		 * completely combined with another.
		 */
		if (disable_repeat) cmd_disable_repeat();
	}
}